

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pShaderOperatorTests.cpp
# Opt level: O1

Vector<float,_2> __thiscall
deqp::gles3::Performance::mean<2>
          (Performance *this,
          vector<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_> *data)

{
  Vector<float,_2> VVar1;
  Vector<float,_2> *res;
  int i_1;
  uint uVar2;
  ulong uVar3;
  pointer pVVar4;
  ulong uVar5;
  int i;
  long lVar6;
  float fVar7;
  Vector<float,_2> sum;
  float afStack_8 [2];
  
  sum.m_data[0] = 0.0;
  sum.m_data[1] = 0.0;
  pVVar4 = (data->super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  uVar3 = (long)(data->
                super__Vector_base<tcu::Vector<float,_2>,_std::allocator<tcu::Vector<float,_2>_>_>).
                _M_impl.super__Vector_impl_data._M_finish - (long)pVVar4 >> 3;
  uVar2 = (uint)uVar3;
  if (0 < (int)uVar2) {
    uVar5 = 0;
    do {
      lVar6 = 0;
      do {
        sum.m_data[lVar6] = pVVar4->m_data[lVar6] + sum.m_data[lVar6];
        lVar6 = lVar6 + 1;
      } while (lVar6 == 1);
      uVar5 = uVar5 + 1;
      pVVar4 = pVVar4 + 1;
    } while (uVar5 != (uVar2 & 0x7fffffff));
  }
  lVar6 = 0;
  do {
    afStack_8[lVar6] = (float)uVar3;
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  *(undefined8 *)this = 0;
  lVar6 = 0;
  do {
    fVar7 = sum.m_data[lVar6] / afStack_8[lVar6];
    *(float *)(this + lVar6 * 4) = fVar7;
    lVar6 = lVar6 + 1;
  } while (lVar6 == 1);
  VVar1.m_data[1] = 0.0;
  VVar1.m_data[0] = fVar7;
  return (Vector<float,_2>)VVar1.m_data;
}

Assistant:

static tcu::Vector<float, N> mean (const vector<tcu::Vector<float, N> >& data)
{
	tcu::Vector<float, N> sum(0.0f);
	for (int i = 0; i < (int)data.size(); i++)
		sum += data[i];
	return sum / tcu::Vector<float, N>((float)data.size());
}